

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_profile.hpp
# Opt level: O0

void __thiscall Omega_h::profile::Strings::~Strings(Strings *this)

{
  Strings *this_local;
  
  std::vector<char,_std::allocator<char>_>::~vector(&this->chars);
  return;
}

Assistant:

std::size_t save(char const* str) {
    auto ret = chars.size();
    while (true) {
      chars.push_back(*str);
      if (*str == '\0') break;
      ++str;
    }
    return ret;
  }